

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conditional_entropy.c
# Opt level: O1

double inform_conditional_entropy(int *xs,int *ys,size_t n,int bx,int by,inform_error *err)

{
  uint32_t *puVar1;
  uint32_t *puVar2;
  bool bVar3;
  _Bool _Var4;
  inform_dist *dist;
  inform_dist *joint;
  size_t sVar5;
  double dVar6;
  
  _Var4 = check_arguments(xs,ys,n,bx,by,err);
  if (_Var4) {
    return NAN;
  }
  dist = inform_dist_alloc((long)bx);
  if (dist == (inform_dist *)0x0) {
    joint = (inform_dist *)0x0;
    if (err == (inform_error *)0x0) {
      bVar3 = true;
      goto LAB_00157975;
    }
  }
  else {
    joint = inform_dist_alloc((long)(bx * by));
    if (joint != (inform_dist *)0x0) {
      bVar3 = false;
      goto LAB_00157975;
    }
    inform_dist_free(dist);
    if (err == (inform_error *)0x0) {
      bVar3 = true;
      goto LAB_00157975;
    }
  }
  *err = INFORM_ENOMEM;
  bVar3 = true;
LAB_00157975:
  if (bVar3) {
    return NAN;
  }
  dist->counts = n;
  joint->counts = n;
  if (n != 0) {
    puVar1 = dist->histogram;
    puVar2 = joint->histogram;
    sVar5 = 0;
    do {
      puVar1[xs[sVar5]] = puVar1[xs[sVar5]] + 1;
      puVar2[(long)ys[sVar5] + (long)xs[sVar5] * (long)by] =
           puVar2[(long)ys[sVar5] + (long)xs[sVar5] * (long)by] + 1;
      sVar5 = sVar5 + 1;
    } while (n != sVar5);
  }
  dVar6 = inform_shannon_ce(joint,dist,2.0);
  inform_dist_free(dist);
  inform_dist_free(joint);
  return dVar6;
}

Assistant:

double inform_conditional_entropy(int const *xs, int const *ys, size_t n,
    int bx, int by, inform_error *err)
{
    if (check_arguments(xs, ys, n, bx, by, err)) return NAN;

    inform_dist *x = NULL, *xy = NULL;
    if (allocate(bx, by, &x, &xy, err)) return NAN;

    accumulate(xs, ys, n, by, x, xy);

    double ce = inform_shannon_ce(xy, x, 2.0);

    free_all(&x, &xy);

    return ce;
}